

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::dispatch::
dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>>
          (dispatch *this,
          vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
          *funcs,Function_Params *plist,Type_Conversions_State *t_conversions)

{
  pointer psVar1;
  pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *ppVar2;
  element_type *peVar3;
  bool bVar4;
  Boxed_Value *pBVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ulong uVar7;
  long lVar8;
  long lVar9;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *func;
  pointer psVar10;
  pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *func_1;
  pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *ppVar11;
  Boxed_Value BVar12;
  size_t numdiffs;
  vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
  ordered_funcs;
  __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
  local_78;
  Type_Conversions_State *local_70;
  element_type *local_68;
  element_type *local_60;
  vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
  local_58;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  local_58.
  super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *)0x0;
  local_58.
  super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *)0x0;
  local_58.
  super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = (element_type *)this;
  Catch::clara::std::
  vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
  ::reserve(&local_58,
            (long)(funcs->
                  super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(funcs->
                  super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 4);
  psVar1 = (funcs->
           super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_38 = funcs;
  local_70 = t_conversions;
  peVar3 = local_60;
  for (psVar10 = (funcs->
                 super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; psVar10 != psVar1;
      psVar10 = psVar10 + 1) {
    local_60 = (psVar10->
               super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
    if (local_60->m_arity == -1) {
      local_78._M_current =
           (pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *)
           ((long)plist->m_end - (long)plist->m_begin >> 4);
      std::
      vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>
      ::emplace_back<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>
                ((vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>
                  *)&local_58,(unsigned_long *)&local_78,&local_60);
      peVar3 = local_60;
    }
    else {
      pBVar5 = plist->m_begin;
      if (local_60->m_arity == (int)((ulong)((long)plist->m_end - (long)pBVar5) >> 4)) {
        local_78._M_current =
             (pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *)0x0;
        if (plist->m_end != pBVar5) {
          lVar9 = 0x18;
          lVar8 = 0;
          uVar7 = 0;
          local_60 = peVar3;
          do {
            bVar4 = Type_Info::bare_equal
                              ((Type_Info *)
                               ((long)&((((psVar10->
                                          super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr)->m_types).
                                        super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_type_info +
                               lVar9),*(Type_Info **)
                                       ((long)&(pBVar5->m_data).
                                               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr + lVar8));
            if (!bVar4) {
              local_78._M_current =
                   (pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *)
                   ((long)&(local_78._M_current)->first + 1);
            }
            uVar7 = uVar7 + 1;
            pBVar5 = plist->m_begin;
            lVar9 = lVar9 + 0x18;
            lVar8 = lVar8 + 0x10;
          } while (uVar7 < (ulong)((long)plist->m_end - (long)pBVar5 >> 4));
          local_60 = (psVar10->
                     super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
        }
        std::
        vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>
        ::emplace_back<unsigned_long&,chaiscript::dispatch::Proxy_Function_Base_const*>
                  ((vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>
                    *)&local_58,(unsigned_long *)&local_78,&local_60);
        peVar3 = local_60;
      }
    }
    local_60 = peVar3;
    peVar3 = local_60;
  }
  uVar7 = 0;
  ppVar11 = local_58.
            super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_60 = peVar3;
  ppVar2 = local_58.
           super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    while (ppVar11 == ppVar2) {
      uVar7 = uVar7 + 1;
      ppVar11 = local_58.
                super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 = local_58.
               super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)((long)plist->m_end - (long)plist->m_begin >> 4) < uVar7) {
        local_78._M_current =
             local_58.
             super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        BVar12 = detail::
                 dispatch_with_conversions<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>const*,std::vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>>,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>>
                           ((detail *)local_68,
                            (__normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                             )local_58.
                              super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,&local_78,plist,local_70,
                            local_38);
        _Var6._M_pi = BVar12.m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
LAB_003d81db:
        if (local_58.
            super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *)0x0) {
          operator_delete(local_58.
                          super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_58.
                                super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.
                                super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          _Var6._M_pi = extraout_RDX;
        }
        BVar12.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var6._M_pi;
        BVar12.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_68;
        return (Boxed_Value)
               BVar12.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
      }
    }
    if ((ppVar11->first == uVar7) &&
       ((uVar7 == 0 || (bVar4 = Proxy_Function_Base::filter(ppVar11->second,plist,local_70), bVar4))
       )) {
      BVar12 = Proxy_Function_Base::operator()
                         ((Proxy_Function_Base *)local_68,(Function_Params *)ppVar11->second,
                          (Type_Conversions_State *)plist);
      _Var6._M_pi = BVar12.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      goto LAB_003d81db;
    }
    ppVar11 = ppVar11 + 1;
  } while( true );
}

Assistant:

Boxed_Value dispatch(const Funcs &funcs, const Function_Params &plist, const Type_Conversions_State &t_conversions) {
      std::vector<std::pair<size_t, const Proxy_Function_Base *>> ordered_funcs;
      ordered_funcs.reserve(funcs.size());

      for (const auto &func : funcs) {
        const auto arity = func->get_arity();

        if (arity == -1) {
          ordered_funcs.emplace_back(plist.size(), func.get());
        } else if (arity == static_cast<int>(plist.size())) {
          size_t numdiffs = 0;
          for (size_t i = 0; i < plist.size(); ++i) {
            if (!func->get_param_types()[i + 1].bare_equal(plist[i].get_type_info())) {
              ++numdiffs;
            }
          }
          ordered_funcs.emplace_back(numdiffs, func.get());
        }
      }

      for (size_t i = 0; i <= plist.size(); ++i) {
        for (const auto &func : ordered_funcs) {
          try {
            if (func.first == i && (i == 0 || func.second->filter(plist, t_conversions))) {
              return (*(func.second))(plist, t_conversions);
            }
          } catch (const exception::bad_boxed_cast &) {
            // parameter failed to cast, try again
          } catch (const exception::arity_error &) {
            // invalid num params, try again
          } catch (const exception::guard_error &) {
            // guard failed to allow the function to execute,
            // try again
          }
        }
      }

      return detail::dispatch_with_conversions(ordered_funcs.cbegin(), ordered_funcs.cend(), plist, t_conversions, funcs);
    }